

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::LimitingInputStream::Next(LimitingInputStream *this,void **data,int *size)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  
  if (0 < this->limit_) {
    iVar2 = (*this->input_->_vptr_ZeroCopyInputStream[2])();
    if ((char)iVar2 == '\0') {
      bVar1 = false;
    }
    else {
      iVar2 = *size;
      lVar3 = this->limit_ - (long)iVar2;
      this->limit_ = lVar3;
      bVar1 = true;
      if (lVar3 < 0) {
        *size = (int)lVar3 + iVar2;
      }
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool LimitingInputStream::Next(const void** data, int* size) {
  if (limit_ <= 0) return false;
  if (!input_->Next(data, size)) return false;

  limit_ -= *size;
  if (limit_ < 0) {
    // We overshot the limit.  Reduce *size to hide the rest of the buffer.
    *size += limit_;
  }
  return true;
}